

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

_Bool build_vault(chunk_conflict *c,loc centre,vault *v)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  char *data_00;
  _Bool _Var4;
  wchar_t wVar5;
  wchar_t y1_00;
  wchar_t y2_00;
  wchar_t x2_00;
  uint32_t uVar6;
  uint32_t uVar7;
  wchar_t wVar8;
  square_conflict *psVar9;
  ushort **ppuVar10;
  char *pcVar11;
  bool bVar12;
  wchar_t local_a8;
  wchar_t temp_1;
  wchar_t tval_1;
  wchar_t temp;
  wchar_t tval;
  loc grid_1;
  loc grid;
  uint uStack_84;
  _Bool reflect;
  wchar_t twid;
  wchar_t thgt;
  wchar_t rotate;
  _Bool icky;
  char racial_symbol [30];
  char *t;
  int local_48;
  wchar_t races_local;
  wchar_t y;
  wchar_t x;
  wchar_t x2;
  wchar_t y2;
  wchar_t x1;
  wchar_t y1;
  char *data;
  vault *v_local;
  chunk_conflict *c_local;
  wchar_t wStack_10;
  loc centre_local;
  
  data_00 = v->text;
  t._4_4_ = 0;
  unique0x10000e95 = centre;
  memset(&rotate,0,0x1e);
  if (c == (chunk_conflict *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                  ,0x566,"_Bool build_vault(struct chunk *, struct loc, struct vault *)");
  }
  event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,v->name);
  if ((wStack_10 < c->height) && (c_local._4_4_ < c->width)) {
    get_random_symmetry_transform
              ((uint)v->hgt,(uint)v->wid,L'\0',L'\0',&twid,(_Bool *)((long)&grid.x + 3),
               (int *)&stack0xffffffffffffff7c,&grid.y);
    if ((v->hgt != uStack_84) || ((uint)v->wid != grid.y)) {
      __assert_fail("v->hgt == thgt && v->wid == twid",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                    ,0x576,"_Bool build_vault(struct chunk *, struct loc, struct vault *)");
    }
    event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,uStack_84 + L'\x02',grid.y + L'\x02');
  }
  else {
    bVar1 = v->hgt;
    bVar2 = v->wid;
    wVar5 = calc_default_transpose_weight((uint)v->hgt,(uint)v->wid);
    get_random_symmetry_transform
              ((uint)bVar1,(uint)bVar2,L'\0',wVar5,&twid,(_Bool *)((long)&grid.x + 3),
               (int *)&stack0xffffffffffffff7c,&grid.y);
    event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,uStack_84 + L'\x02',grid.y + L'\x02');
    _Var4 = find_space((loc *)((long)&c_local + 4),uStack_84 + L'\x02',grid.y + L'\x02');
    if (!_Var4) {
      return false;
    }
  }
  wVar5 = c_local._4_4_ - grid.y / 2;
  y1_00 = wStack_10 - (int)uStack_84 / 2;
  stack0xffffffffffffffec = (loc)CONCAT44(y1_00,wVar5);
  y2_00 = y1_00 + uStack_84 + L'\xffffffff';
  x2_00 = wVar5 + grid.y + L'\xffffffff';
  generate_mark(c,y1_00,wVar5,y2_00,x2_00,L'\x0e');
  local_48 = 0;
  unique0x10000e7d = data_00;
  while( true ) {
    bVar12 = false;
    if (local_48 < (int)(uint)v->hgt) {
      bVar12 = *stack0xffffffffffffffa8 != '\0';
    }
    if (!bVar12) break;
    races_local = L'\0';
    while( true ) {
      bVar12 = false;
      if (races_local < (int)(uint)v->wid) {
        bVar12 = *stack0xffffffffffffffa8 != '\0';
      }
      if (!bVar12) break;
      grid_1 = loc(races_local,local_48);
      symmetry_transform(&grid_1,wStack_10,c_local._4_4_,(uint)v->hgt,(uint)v->wid,twid,
                         (_Bool)(grid.x._3_1_ & 1));
      if (((grid_1.x < wVar5) || (x2_00 < grid_1.x)) || ((grid_1.y < y1_00 || (y2_00 < grid_1.y))))
      {
        __assert_fail("grid.x >= x1 && grid.x <= x2 && grid.y >= y1 && grid.y <= y2",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                      ,0x590,"_Bool build_vault(struct chunk *, struct loc, struct vault *)");
      }
      if (*stack0xffffffffffffffa8 != ' ') {
        square_set_feat((chunk *)c,(loc_conflict)grid_1,L'\x01');
        _Var4 = square_isempty((chunk *)c,(loc_conflict)grid_1);
        if (!_Var4) {
          __assert_fail("square_isempty(c, grid)",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                        ,0x599,"_Bool build_vault(struct chunk *, struct loc, struct vault *)");
        }
        thgt._3_1_ = 1;
        switch(*stack0xffffffffffffffa8) {
        case '#':
          set_marked_granite(c,grid_1,L'\r');
          break;
        case '%':
          set_marked_granite(c,grid_1,L'\f');
          _Var4 = flag_has_dbg(v->flags,1,1,"v->flags","ROOMF_FEW_ENTRANCES");
          if (_Var4) {
            append_entrance(grid_1);
          }
          thgt._3_1_ = 0;
          break;
        case '&':
          uVar6 = Rand_div(100);
          if ((int)uVar6 < 0x4b) {
            place_object(c,grid_1,c->depth,false,false,'\x05',L'\0');
          }
          else {
            uVar6 = Rand_div(4);
            if (uVar6 == 0) {
              place_trap((chunk_conflict2 *)c,(loc_conflict)grid_1,L'\xffffffff',c->depth);
            }
          }
          break;
        case '*':
          uVar6 = Rand_div(2);
          wVar8 = L'\x14';
          if (uVar6 == 0) {
            wVar8 = L'\x13';
          }
          square_set_feat((chunk *)c,(loc_conflict)grid_1,wVar8);
          break;
        case '+':
          place_secret_door(c,grid_1);
          break;
        case '/':
          break;
        case ':':
          uVar6 = Rand_div(2);
          wVar8 = L'\x10';
          if (uVar6 == 0) {
            wVar8 = L'\x18';
          }
          square_set_feat((chunk *)c,(loc_conflict)grid_1,wVar8);
          break;
        case ';':
          break;
        case '<':
          if ((dun->persist & 1U) == 0) {
            square_set_feat((chunk *)c,(loc_conflict)grid_1,L'\x05');
          }
          break;
        case '>':
          if ((dun->persist & 1U) == 0) {
            if (((dun->quest & 1U) == 0) && (c->depth < (int)(z_info->max_depth - 1))) {
              square_set_feat((chunk *)c,(loc_conflict)grid_1,L'\x06');
            }
            else {
              square_set_feat((chunk *)c,(loc_conflict)grid_1,L'\x05');
            }
          }
          break;
        case '@':
          square_set_feat((chunk *)c,(loc_conflict)grid_1,L'\x16');
          break;
        case '^':
          uVar6 = Rand_div(4);
          if (uVar6 == 0) {
            place_trap((chunk_conflict2 *)c,(loc_conflict)grid_1,L'\xffffffff',c->depth);
          }
          break;
        case '`':
          square_set_feat((chunk *)c,(loc_conflict)grid_1,L'\x17');
        }
        psVar9 = square((chunk *)c,(loc_conflict)grid_1);
        flag_on_dbg(psVar9->info,3,4,"square(c, grid)->info","SQUARE_ROOM");
        if ((thgt._3_1_ & 1) != 0) {
          psVar9 = square((chunk *)c,(loc_conflict)grid_1);
          flag_on_dbg(psVar9->info,3,3,"square(c, grid)->info","SQUARE_VAULT");
        }
      }
      races_local = races_local + L'\x01';
      register0x00000000 = stack0xffffffffffffffa8 + 1;
    }
    local_48 = local_48 + 1;
  }
  local_48 = 0;
  unique0x10000e75 = data_00;
  do {
    bVar12 = false;
    if (local_48 < (int)(uint)v->hgt) {
      bVar12 = *stack0xffffffffffffffa8 != '\0';
    }
    if (!bVar12) {
      get_vault_monsters((chunk *)c,(char *)&rotate,v->typ,data_00,y1_00,y2_00,wVar5,x2_00);
      return true;
    }
    races_local = L'\0';
    while( true ) {
      bVar12 = false;
      if (races_local < (int)(uint)v->wid) {
        bVar12 = *stack0xffffffffffffffa8 != '\0';
      }
      if (!bVar12) break;
      _temp = (loc_conflict)loc(races_local,local_48);
      symmetry_transform((loc *)&temp,wStack_10,c_local._4_4_,(uint)v->hgt,(uint)v->wid,twid,
                         (_Bool)(grid.x._3_1_ & 1));
      if ((((temp < wVar5) || (x2_00 < temp)) || (tval < y1_00)) || (y2_00 < tval)) {
        __assert_fail("grid.x >= x1 && grid.x <= x2 && grid.y >= y1 && grid.y <= y2",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                      ,0x5f1,"_Bool build_vault(struct chunk *, struct loc, struct vault *)");
      }
      if (*stack0xffffffffffffffa8 != ' ') {
        ppuVar10 = __ctype_b_loc();
        if (((((*ppuVar10)[(int)*stack0xffffffffffffffa8] & 0x400) == 0) ||
            (*stack0xffffffffffffffa8 == 'x')) || (*stack0xffffffffffffffa8 == 'X')) {
          switch(*stack0xffffffffffffffa8) {
          case '!':
            iVar3 = c->depth;
            uVar6 = Rand_div(4);
            place_object(c,(loc)_temp,iVar3 + L'\x03',(_Bool)((uVar6 != 0 ^ 0xffU) & 1),false,'\x05'
                         ,L'\x1a');
            break;
          case '\"':
            iVar3 = c->depth;
            uVar6 = Rand_div(4);
            place_object(c,(loc)_temp,iVar3 + L'\x03',(_Bool)((uVar6 != 0 ^ 0xffU) & 1),false,'\x05'
                         ,L'\x14');
            break;
          case '#':
            _Var4 = square_isroom((chunk *)c,_temp);
            if (((!_Var4) || (_Var4 = square_isvault((chunk *)c,_temp), !_Var4)) ||
               (_Var4 = square_isgranite((chunk *)c,_temp), !_Var4)) {
LAB_0016a913:
              __assert_fail("square_isroom(c, grid) && square_isvault(c, grid) && square_isgranite(c, grid) && sqinfo_has(square(c, grid)->info, SQUARE_WALL_SOLID)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                            ,0x681,"_Bool build_vault(struct chunk *, struct loc, struct vault *)");
            }
            psVar9 = square((chunk *)c,_temp);
            _Var4 = flag_has_dbg(psVar9->info,3,0xd,"square(c, grid)->info","SQUARE_WALL_SOLID");
            if (!_Var4) goto LAB_0016a913;
            wVar8 = count_neighbors((loc *)0x0,c,(loc)_temp,square_isroom,false);
            if (wVar8 == L'\b') {
              psVar9 = square((chunk *)c,_temp);
              flag_off(psVar9->info,3,0xd);
              psVar9 = square((chunk *)c,_temp);
              flag_on_dbg(psVar9->info,3,0xb,"square(c, grid)->info","SQUARE_WALL_INNER");
            }
            break;
          case '$':
            place_gold(c,(loc)_temp,c->depth,'\x05');
            break;
          case ',':
            iVar3 = c->depth;
            uVar6 = Rand_div(4);
            place_object(c,(loc)_temp,iVar3 + L'\x03',(_Bool)((uVar6 != 0 ^ 0xffU) & 1),false,'\x05'
                         ,L'\x1c');
            break;
          case '-':
            iVar3 = c->depth;
            uVar6 = Rand_div(4);
            uVar7 = Rand_div(2);
            wVar8 = L'\x18';
            if (uVar7 == 0) {
              wVar8 = L'\x17';
            }
            place_object(c,(loc)_temp,iVar3 + L'\x03',(_Bool)((uVar6 != 0 ^ 0xffU) & 1),false,'\x05'
                         ,wVar8);
            break;
          case '0':
            pick_and_place_monster((chunk *)c,_temp,c->depth + L'\x14',true,true,'\r');
            break;
          case '1':
            uVar6 = Rand_div(2);
            if (uVar6 == 0) {
              pick_and_place_monster((chunk *)c,_temp,c->depth,true,true,'\r');
            }
            else {
              uVar6 = Rand_div(2);
              if (uVar6 == 0) {
                wVar8 = c->depth;
                uVar6 = Rand_div(8);
                place_object(c,(loc)_temp,wVar8,uVar6 == 0,false,'\x05',L'\0');
              }
              else {
                uVar6 = Rand_div(4);
                if (uVar6 == 0) {
                  place_trap((chunk_conflict2 *)c,_temp,L'\xffffffff',c->depth);
                }
              }
            }
            break;
          case '2':
            pick_and_place_monster((chunk *)c,_temp,c->depth + L'\x05',true,true,'\r');
            break;
          case '3':
            place_object(c,(loc)_temp,c->depth + L'\x03',false,false,'\x05',L'\0');
            break;
          case '4':
            uVar6 = Rand_div(2);
            if (uVar6 == 0) {
              pick_and_place_monster((chunk *)c,_temp,c->depth + L'\x03',true,true,'\r');
            }
            uVar6 = Rand_div(2);
            if (uVar6 == 0) {
              place_object(c,(loc)_temp,c->depth + L'\a',false,false,'\x05',L'\0');
            }
            break;
          case '5':
            place_object(c,(loc)_temp,c->depth + L'\a',false,false,'\x05',L'\0');
            break;
          case '6':
            pick_and_place_monster((chunk *)c,_temp,c->depth + L'\v',true,true,'\r');
            break;
          case '7':
            place_object(c,(loc)_temp,c->depth + L'\x0f',false,false,'\x05',L'\0');
            break;
          case '8':
            pick_and_place_monster((chunk *)c,_temp,c->depth + L'(',true,true,'\r');
            place_object(c,(loc)_temp,c->depth + L'\x14',true,true,'\x05',L'\0');
            break;
          case '9':
            pick_and_place_monster((chunk *)c,_temp,c->depth + L'\t',true,true,'\r');
            place_object(c,(loc)_temp,c->depth + L'\a',true,false,'\x05',L'\0');
            break;
          case '=':
            iVar3 = c->depth;
            uVar6 = Rand_div(4);
            place_object(c,(loc)_temp,iVar3 + L'\x03',(_Bool)((uVar6 != 0 ^ 0xffU) & 1),false,'\x05'
                         ,L'\x15');
            break;
          case '?':
            iVar3 = c->depth;
            uVar6 = Rand_div(4);
            place_object(c,(loc)_temp,iVar3 + L'\x03',(_Bool)((uVar6 != 0 ^ 0xffU) & 1),false,'\x05'
                         ,L'\x19');
            break;
          case '@':
            _Var4 = square_isroom((chunk *)c,_temp);
            if (((!_Var4) || (_Var4 = square_isvault((chunk *)c,_temp), !_Var4)) ||
               (_Var4 = square_isperm((chunk *)c,_temp), !_Var4)) {
              __assert_fail("square_isroom(c, grid) && square_isvault(c, grid) && square_isperm(c, grid)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                            ,0x695,"_Bool build_vault(struct chunk *, struct loc, struct vault *)");
            }
            wVar8 = count_neighbors((loc *)0x0,c,(loc)_temp,square_isroom,false);
            if (wVar8 == L'\b') {
              psVar9 = square((chunk *)c,_temp);
              flag_on_dbg(psVar9->info,3,0xb,"square(c, grid)->info","SQUARE_WALL_INNER");
            }
            break;
          case ']':
            tval_1 = L'\0';
            uVar6 = Rand_div(3);
            if (uVar6 == 0) {
              uVar6 = Rand_div(9);
            }
            else {
              uVar6 = Rand_div(8);
            }
            switch(uVar6) {
            case 0:
              tval_1 = L'\n';
              break;
            case 1:
              tval_1 = L'\v';
              break;
            case 2:
              tval_1 = L'\f';
              break;
            case 3:
              tval_1 = L'\r';
              break;
            case 4:
              tval_1 = L'\x0e';
              break;
            case 5:
              tval_1 = L'\x0f';
              break;
            case 6:
              tval_1 = L'\x10';
              break;
            case 7:
              tval_1 = L'\x11';
              break;
            case 8:
              tval_1 = L'\x12';
            }
            place_object(c,(loc)_temp,c->depth + L'\x03',true,false,'\x05',tval_1);
            break;
          case '_':
            iVar3 = c->depth;
            uVar6 = Rand_div(4);
            place_object(c,(loc)_temp,iVar3 + L'\x03',(_Bool)((uVar6 != 0 ^ 0xffU) & 1),false,'\x05'
                         ,L'\x16');
            break;
          case '|':
            local_a8 = L'\0';
            uVar6 = Rand_div(4);
            switch(uVar6) {
            case 0:
              local_a8 = L'\t';
              break;
            case 1:
              local_a8 = L'\b';
              break;
            case 2:
              local_a8 = L'\a';
              break;
            case 3:
              local_a8 = L'\x05';
            }
            place_object(c,(loc)_temp,c->depth + L'\x03',true,false,'\x05',local_a8);
            break;
          case '~':
            place_object(c,(loc)_temp,c->depth + L'\x05',false,false,'\x05',L'\x01');
          }
        }
        else {
          pcVar11 = strchr((char *)&rotate,(int)*stack0xffffffffffffffa8);
          if ((pcVar11 == (char *)0x0) && (t._4_4_ < 0x1e)) {
            *(char *)((long)&rotate + (long)t._4_4_) = *stack0xffffffffffffffa8;
            t._4_4_ = t._4_4_ + 1;
          }
        }
      }
      races_local = races_local + L'\x01';
      register0x00000000 = stack0xffffffffffffffa8 + 1;
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

bool build_vault(struct chunk *c, struct loc centre, struct vault *v)
{
	const char *data = v->text;
	int y1, x1, y2, x2;
	int x, y, races_local = 0;
	const char *t;
	char racial_symbol[30] = "";
	bool icky;
	int rotate, thgt, twid;
	bool reflect;

	assert(c);

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, v->name);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		get_random_symmetry_transform(v->hgt, v->wid, SYMTR_FLAG_NONE,
			calc_default_transpose_weight(v->hgt, v->wid),
			&rotate, &reflect, &thgt, &twid);
		event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,
			thgt + 2, twid + 2);
		if (!find_space(&centre, thgt + 2, twid + 2))
			return (false);
	} else {
		/* Given the preset centre, don't allow transposition. */
		get_random_symmetry_transform(v->hgt, v->wid, SYMTR_FLAG_NONE,
			0, &rotate, &reflect, &thgt, &twid);
		assert(v->hgt == thgt && v->wid == twid);
		event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,
			thgt + 2, twid + 2);
	}

	/* Convert centre to translation for the symmetry transformation. */
	centre.x -= twid / 2;
	centre.y -= thgt / 2;

	/* Get the room corners */
	y1 = centre.y;
	x1 = centre.x;
	y2 = y1 + thgt - 1;
	x2 = x1 + twid - 1;

	/* No random monsters in vaults. */
	generate_mark(c, y1, x1, y2, x2, SQUARE_MON_RESTRICT);

	/* Place dungeon features and objects */
	for (t = data, y = 0; y < v->hgt && *t; y++) {
		for (x = 0; x < v->wid && *t; x++, t++) {
			struct loc grid = loc(x, y);

			symmetry_transform(&grid, centre.y, centre.x, v->hgt,
				v->wid, rotate, reflect);
			assert(grid.x >= x1 && grid.x <= x2 &&
				grid.y >= y1 && grid.y <= y2);

			/* Skip non-grids */
			if (*t == ' ') continue;

			/* Lay down a floor */
			square_set_feat(c, grid, FEAT_FLOOR);

			/* Debugging assertion */
			assert(square_isempty(c, grid));

			/* By default vault squares are marked icky */
			icky = true;

			/* Analyze the grid */
			switch (*t) {
			case '%': {
				/* In this case, the square isn't really part
				 * of the vault, but rather is part of the
				 * "door step" to the vault. We don't mark it
				 * icky so that the tunneling code knows it's
				 * allowed to remove this wall. */
				set_marked_granite(c, grid, SQUARE_WALL_OUTER);
				if (roomf_has(v->flags, ROOMF_FEW_ENTRANCES)) {
					append_entrance(grid);
				}
				icky = false;
				break;
			}
				/* Inner or non-tunnelable outside granite wall */
			case '#': set_marked_granite(c, grid, SQUARE_WALL_SOLID); break;
				/* Permanent wall */
			case '@': square_set_feat(c, grid, FEAT_PERM); break;
				/* Gold seam */
			case '*': {
				square_set_feat(c, grid, one_in_(2) ? FEAT_MAGMA_K :
								FEAT_QUARTZ_K);
				break;
			}
				/* Rubble */
			case ':': {
				square_set_feat(c, grid, one_in_(2) ? FEAT_PASS_RUBBLE :
								FEAT_RUBBLE);
				break;
			}
				/* Secret door */
			case '+': place_secret_door(c, grid); break;
				/* Trap */
			case '^': if (one_in_(4)) place_trap(c, grid, -1, c->depth); break;
				/* Treasure or a trap */
			case '&': {
				if (randint0(100) < 75) {
					place_object(c, grid, c->depth, false, false, ORIGIN_VAULT,
								 0);
				} else if (one_in_(4)) {
					place_trap(c, grid, -1, c->depth);
				}
				break;
			}
				/* Stairs */
			case '<': {
				if (dun->persist) break;
				square_set_feat(c, grid, FEAT_LESS); break;
			}
			case '>': {
				if (dun->persist) break;
				/* No down stairs at bottom or on quests */
				if (dun->quest || c->depth
						>= z_info->max_depth - 1) {
					square_set_feat(c, grid, FEAT_LESS);
				} else {
					square_set_feat(c, grid, FEAT_MORE);
				}
				break;
			}
				/* Lava */
			case '`': square_set_feat(c, grid, FEAT_LAVA); break;
				/* Included to allow simple inclusion of FA vaults */
			case '/': /*square_set_feat(c, grid, FEAT_WATER)*/; break;
			case ';': /*square_set_feat(c, grid, FEAT_TREE)*/; break;
			}

			/* Part of a vault */
			sqinfo_on(square(c, grid)->info, SQUARE_ROOM);
			if (icky) sqinfo_on(square(c, grid)->info, SQUARE_VAULT);
		}
	}


	/* Place regular dungeon monsters and objects, convert inner walls */
	for (t = data, y = 0; y < v->hgt && *t; y++) {
		for (x = 0; x < v->wid && *t; x++, t++) {
			struct loc grid = loc(x, y);

			symmetry_transform(&grid, centre.y, centre.x, v->hgt,
				v->wid, rotate, reflect);
			assert(grid.x >= x1 && grid.x <= x2 &&
				grid.y >= y1 && grid.y <= y2);

			/* Hack -- skip "non-grids" */
			if (*t == ' ') continue;

			/* Most alphabetic characters signify monster races. */
			if (isalpha(*t) && (*t != 'x') && (*t != 'X')) {
				/* If the symbol is not yet stored, ... */
				if (!strchr(racial_symbol, *t)) {
					/* ... store it for later processing. */
					if (races_local < 30)
						racial_symbol[races_local++] = *t;
				}
			}

			/* Otherwise, analyze the symbol */
			else
				switch (*t) {
					/* An ordinary monster, object (sometimes good), or trap. */
				case '1': {
					if (one_in_(2)) {
						pick_and_place_monster(c, grid, c->depth , true, true,
											   ORIGIN_DROP_VAULT);
					} else if (one_in_(2)) {
						place_object(c, grid, c->depth,
									 one_in_(8) ? true : false, false,
									 ORIGIN_VAULT, 0);
					} else if (one_in_(4)) {
						place_trap(c, grid, -1, c->depth);
					}
					break;
				}
					/* Slightly out of depth monster. */
				case '2': pick_and_place_monster(c, grid, c->depth + 5, true,
												 true, ORIGIN_DROP_VAULT);
					break;
					/* Slightly out of depth object. */
				case '3': place_object(c, grid, c->depth + 3, false, false, 
									   ORIGIN_VAULT, 0); break;
					/* Monster and/or object */
				case '4': {
					if (one_in_(2))
						pick_and_place_monster(c, grid, c->depth + 3, true, 
											   true, ORIGIN_DROP_VAULT);
					if (one_in_(2))
						place_object(c, grid, c->depth + 7, false, false,
									 ORIGIN_VAULT, 0);
					break;
				}
					/* Out of depth object. */
				case '5': place_object(c, grid, c->depth + 7, false, false,
									   ORIGIN_VAULT, 0); break;
					/* Out of depth monster. */
				case '6': pick_and_place_monster(c, grid, c->depth + 11, true,
												 true, ORIGIN_DROP_VAULT);
					break;
					/* Very out of depth object. */
				case '7': place_object(c, grid, c->depth + 15, false, false,
									   ORIGIN_VAULT, 0); break;
					/* Very out of depth monster. */
				case '0': pick_and_place_monster(c, grid, c->depth + 20, true,
												 true, ORIGIN_DROP_VAULT);
					break;
					/* Meaner monster, plus treasure */
				case '9': {
					pick_and_place_monster(c, grid, c->depth + 9, true, true,
										   ORIGIN_DROP_VAULT);
					place_object(c, grid, c->depth + 7, true, false,
								 ORIGIN_VAULT, 0);
					break;
				}
					/* Nasty monster and treasure */
				case '8': {
					pick_and_place_monster(c, grid, c->depth + 40, true, true,
										   ORIGIN_DROP_VAULT);
					place_object(c, grid, c->depth + 20, true, true,
								 ORIGIN_VAULT, 0);
					break;
				}
					/* A chest. */
				case '~': place_object(c, grid, c->depth + 5, false, false,
									   ORIGIN_VAULT, TV_CHEST); break;
					/* Treasure. */
				case '$': place_gold(c, grid, c->depth, ORIGIN_VAULT);break;
					/* Armour. */
				case ']': {
					int	tval = 0, temp = one_in_(3) ? randint1(9) : randint1(8);
					switch (temp) {
					case 1: tval = TV_BOOTS; break;
					case 2: tval = TV_GLOVES; break;
					case 3: tval = TV_HELM; break;
					case 4: tval = TV_CROWN; break;
					case 5: tval = TV_SHIELD; break;
					case 6: tval = TV_CLOAK; break;
					case 7: tval = TV_SOFT_ARMOR; break;
					case 8: tval = TV_HARD_ARMOR; break;
					case 9: tval = TV_DRAG_ARMOR; break;
					}
					place_object(c, grid, c->depth + 3, true, false,
								 ORIGIN_VAULT, tval);
					break;
				}
					/* Weapon. */
				case '|': {
					int	tval = 0, temp = randint1(4);
					switch (temp) {
					case 1: tval = TV_SWORD; break;
					case 2: tval = TV_POLEARM; break;
					case 3: tval = TV_HAFTED; break;
					case 4: tval = TV_BOW; break;
					}
					place_object(c, grid, c->depth + 3, true, false,
								 ORIGIN_VAULT, tval);
					break;
				}
					/* Ring. */
				case '=': place_object(c, grid, c->depth + 3, one_in_(4), false,
									   ORIGIN_VAULT, TV_RING); break;
					/* Amulet. */
				case '"': place_object(c, grid, c->depth + 3, one_in_(4), false,
									   ORIGIN_VAULT, TV_AMULET); break;
					/* Potion. */
				case '!': place_object(c, grid, c->depth + 3, one_in_(4), false,
									   ORIGIN_VAULT, TV_POTION); break;
					/* Scroll. */
				case '?': place_object(c, grid, c->depth + 3, one_in_(4), false,
									   ORIGIN_VAULT, TV_SCROLL); break;
					/* Staff. */
				case '_': place_object(c, grid, c->depth + 3, one_in_(4), false,
									   ORIGIN_VAULT, TV_STAFF); break;
					/* Wand or rod. */
				case '-': place_object(c, grid, c->depth + 3, one_in_(4), false,
									   ORIGIN_VAULT,
									   one_in_(2) ? TV_WAND : TV_ROD);
					break;
					/* Food or mushroom. */
				case ',': place_object(c, grid, c->depth + 3, one_in_(4), false,
									   ORIGIN_VAULT, TV_FOOD); break;
					/* Inner or non-tunnelable outside granite wall */
				case '#': {
					/* Check consistency with first pass. */
					assert(square_isroom(c, grid) &&
						square_isvault(c, grid) &&
						square_isgranite(c, grid) &&
						sqinfo_has(square(c, grid)->info, SQUARE_WALL_SOLID));
					/*
					 * Convert to SQUARE_WALL_INNER if it
					 * does not touch the outside of the
					 * vault.
					 */
					if (count_neighbors(NULL, c, grid,
							square_isroom, false) == 8) {
						sqinfo_off(square(c, grid)->info,
							SQUARE_WALL_SOLID);
						sqinfo_on(square(c, grid)->info,
							SQUARE_WALL_INNER);
					}
					break;
				}
					/* Permanent wall */
				case '@': {
					/* Check consistency with first pass. */
					assert(square_isroom(c, grid) &&
						square_isvault(c, grid) &&
						square_isperm(c, grid));
					/*
					 * Mark as SQUARE_WALL_INNER if it does
					 * not touch the outside of the vault.
					 */
					if (count_neighbors(NULL, c, grid,
							square_isroom, false) == 8) {
						sqinfo_on(square(c, grid)->info,
							SQUARE_WALL_INNER);
					}
					break;
				}
				}
		}
	}

	/* Place specified monsters */
	get_vault_monsters(c, racial_symbol, v->typ, data, y1, y2, x1, x2);

	return true;
}